

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginViewportSideBar
               (char *name,ImGuiViewport *viewport_p,ImGuiDir dir,float axis_size,
               ImGuiWindowFlags window_flags)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  uint in_ECX;
  int in_EDX;
  ImGuiViewportP *in_RSI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  ImRect IVar10;
  bool is_open;
  ImVec2 size;
  ImVec2 pos;
  ImGuiAxis axis;
  ImRect avail_rect;
  ImGuiViewportP *viewport;
  ImGuiWindow *bar_window;
  ImGuiWindowFlags in_stack_00000394;
  bool *in_stack_00000398;
  char *in_stack_000003a0;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  float fVar11;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  int count;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float in_stack_ffffffffffffffa8;
  float in_stack_ffffffffffffffac;
  float in_stack_ffffffffffffffb4;
  ImVec2 local_38;
  ImGuiViewportP *local_30;
  ImGuiWindow *local_28;
  uint local_1c;
  float local_18;
  int local_14;
  ImGuiViewportP *local_10;
  undefined1 auVar7 [56];
  undefined1 extraout_var [56];
  undefined1 auVar9 [56];
  
  count = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  auVar9 = in_ZMM1._8_56_;
  auVar7 = in_ZMM0._8_56_;
  local_18 = in_ZMM0._0_4_;
  local_1c = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = FindWindowByName((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
  ;
  if ((local_28 == (ImGuiWindow *)0x0) || (local_28->BeginCount == 0)) {
    if (local_10 == (ImGuiViewportP *)0x0) {
      local_10 = (ImGuiViewportP *)GetMainViewport();
    }
    local_30 = local_10;
    IVar10 = ImGuiViewportP::GetBuildWorkRect(local_10);
    count = (int)((ulong)local_10 >> 0x20);
    auVar8._0_8_ = IVar10.Max;
    auVar8._8_56_ = auVar9;
    auVar5._0_8_ = IVar10.Min;
    auVar5._8_56_ = auVar7;
    uVar1 = vmovlpd_avx(auVar5._0_16_);
    in_stack_ffffffffffffffb4 = (float)uVar1;
    local_38 = (ImVec2)vmovlpd_avx(auVar8._0_16_);
    uVar3 = (uint)(local_14 == 2 || local_14 == 3);
    if ((local_14 == 1) || (local_14 == 3)) {
      pfVar4 = ImVec2::operator[](&local_38,(long)(int)uVar3);
      fVar11 = *pfVar4 - local_18;
      pfVar4 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffb4,(long)(int)uVar3);
      *pfVar4 = fVar11;
    }
    auVar6._0_8_ = ImRect::GetSize((ImRect *)
                                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    auVar6._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar6._0_16_);
    in_stack_ffffffffffffffac = (float)uVar1;
    fVar11 = local_18;
    pfVar4 = ImVec2::operator[]((ImVec2 *)&stack0xffffffffffffffac,(long)(int)uVar3);
    *pfVar4 = fVar11;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa4,0.0,0.0);
    SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffb4,0,(ImVec2 *)&stack0xffffffffffffffa4);
    SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffac,0);
    if ((local_14 == 2) || (local_14 == 0)) {
      fVar11 = local_18;
      pfVar4 = ImVec2::operator[](&local_30->BuildWorkOffsetMin,(long)(int)uVar3);
      *pfVar4 = fVar11 + *pfVar4;
    }
    else if ((local_14 == 3) || (local_14 == 1)) {
      fVar11 = local_18;
      pfVar4 = ImVec2::operator[](&local_30->BuildWorkOffsetMax,(long)(int)uVar3);
      *pfVar4 = *pfVar4 - fVar11;
    }
  }
  local_1c = local_1c | 7;
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff9c,0.0,0.0);
  PushStyleVar((ImGuiStyleVar)in_stack_ffffffffffffffb4,
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar2 = Begin(in_stack_000003a0,in_stack_00000398,in_stack_00000394);
  PopStyleVar(count);
  return bVar2;
}

Assistant:

bool ImGui::BeginViewportSideBar(const char* name, ImGuiViewport* viewport_p, ImGuiDir dir, float axis_size, ImGuiWindowFlags window_flags)
{
    IM_ASSERT(dir != ImGuiDir_None);

    ImGuiWindow* bar_window = FindWindowByName(name);
    if (bar_window == NULL || bar_window->BeginCount == 0)
    {
        // Calculate and set window size/position
        ImGuiViewportP* viewport = (ImGuiViewportP*)(void*)(viewport_p ? viewport_p : GetMainViewport());
        ImRect avail_rect = viewport->GetBuildWorkRect();
        ImGuiAxis axis = (dir == ImGuiDir_Up || dir == ImGuiDir_Down) ? ImGuiAxis_Y : ImGuiAxis_X;
        ImVec2 pos = avail_rect.Min;
        if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
            pos[axis] = avail_rect.Max[axis] - axis_size;
        ImVec2 size = avail_rect.GetSize();
        size[axis] = axis_size;
        SetNextWindowPos(pos);
        SetNextWindowSize(size);

        // Report our size into work area (for next frame) using actual window size
        if (dir == ImGuiDir_Up || dir == ImGuiDir_Left)
            viewport->BuildWorkOffsetMin[axis] += axis_size;
        else if (dir == ImGuiDir_Down || dir == ImGuiDir_Right)
            viewport->BuildWorkOffsetMax[axis] -= axis_size;
    }

    window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0)); // Lift normal size constraint
    bool is_open = Begin(name, NULL, window_flags);
    PopStyleVar(2);

    return is_open;
}